

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationGeometryGridRenderTests.cpp
# Opt level: O2

TestCaseGroup * vkt::tessellation::createGeometryGridRenderScatterTests(TestContext *testCtx)

{
  TestCaseGroup *pTVar1;
  GridRenderTestCase *this;
  long lVar2;
  allocator<char> local_8a;
  allocator<char> local_89;
  TestContext *local_88;
  MovePtr<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_> group;
  string local_70;
  string local_50;
  
  pTVar1 = (TestCaseGroup *)operator_new(0x70);
  local_88 = testCtx;
  tcu::TestCaseGroup::TestCaseGroup(pTVar1,testCtx,"scatter","Scatter output primitives");
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       pTVar1;
  for (lVar2 = 0x10;
      pTVar1 = group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.
               m_data.ptr, lVar2 != 0x58; lVar2 = lVar2 + 0x18) {
    this = (GridRenderTestCase *)operator_new(0x88);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,
               *(char **)((long)&createGeometryGridRenderLimitsTests::cases[2].flags + lVar2),
               &local_89);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,*(char **)(&UNK_00bdbe88 + lVar2),&local_8a);
    anon_unknown_1::GridRenderTestCase::GridRenderTestCase
              (this,local_88,&local_70,&local_50,
               *(Flags *)((long)&createGeometryGridRenderScatterTests::cases[0].name + lVar2));
    tcu::TestNode::addChild(&pTVar1->super_TestNode,(TestNode *)this);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>.m_data.ptr =
       (TestCaseGroup *)0x0;
  de::details::UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>::~UniqueBase
            (&group.super_UniqueBase<tcu::TestCaseGroup,_de::DefaultDeleter<tcu::TestCaseGroup>_>);
  return pTVar1;
}

Assistant:

tcu::TestCaseGroup* createGeometryGridRenderScatterTests (tcu::TestContext& testCtx)
{
	de::MovePtr<tcu::TestCaseGroup> group (new tcu::TestCaseGroup(testCtx, "scatter", "Scatter output primitives"));

	static const TestCaseDescription cases[] =
	{
		{
			"geometry_scatter_instances",
			"Each geometry shader instance outputs its primitives far from other instances of the same execution",
			FLAG_GEOMETRY_SCATTER_INSTANCES
		},
		{
			"geometry_scatter_primitives",
			"Each geometry shader instance outputs its primitives far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_PRIMITIVES | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
		{
			"geometry_scatter_layers",
			"Each geometry shader instance outputs its primitives to multiple layers and far from other primitives of the same instance",
			FLAG_GEOMETRY_SCATTER_LAYERS | FLAG_GEOMETRY_SEPARATE_PRIMITIVES
		},
	};

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(cases); ++ndx)
		group->addChild(new GridRenderTestCase(testCtx, cases[ndx].name, cases[ndx].desc, cases[ndx].flags));

	return group.release();
}